

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O2

bool isPalindrome(string *pal)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  pcVar1 = (pal->_M_dataplus)._M_p;
  uVar2 = pal->_M_string_length;
  iVar4 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2);
  iVar3 = -1;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  lVar5 = uVar2 << 0x20;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    lVar5 = lVar5 + -0x100000000;
    if (iVar3 + 1 == uVar6) break;
    uVar2 = uVar6 + 1;
  } while (pcVar1[uVar6] == pcVar1[lVar5 >> 0x20]);
  return (long)iVar4 < (long)uVar6;
}

Assistant:

bool isPalindrome(const string& pal){
    int length = pal.length();
    for(int i=0;i<length/2+1;i++){
        if(pal[i] != pal[length-i-1]){
            return false;
        }
    }

    return true;
}